

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

int inflateCopy(z_streamp dest,z_streamp source)

{
  internal_state *__src;
  long lVar1;
  int iVar2;
  internal_state *__dest;
  voidpf pvStack_38;
  uint wsize;
  uchar *window;
  inflate_state *copy;
  inflate_state *state;
  z_streamp source_local;
  z_streamp dest_local;
  
  iVar2 = inflateStateCheck(source);
  if ((iVar2 == 0) && (dest != (z_streamp)0x0)) {
    __src = source->state;
    __dest = (internal_state *)(*source->zalloc)(source->opaque,1,0x1bf8);
    if (__dest == (internal_state *)0x0) {
      dest_local._4_4_ = -4;
    }
    else {
      pvStack_38 = (void *)0x0;
      lVar1._0_1_ = __src->method;
      lVar1._1_3_ = *(undefined3 *)&__src->field_0x49;
      lVar1._4_4_ = __src->last_flush;
      if ((lVar1 == 0) ||
         (pvStack_38 = (*source->zalloc)(source->opaque,
                                         1 << ((byte)*(undefined4 *)&__src->gzhead & 0x1f),1),
         pvStack_38 != (voidpf)0x0)) {
        memcpy(dest,source,0x70);
        memcpy(__dest,__src,0x1bf8);
        __dest->strm = dest;
        if ((__src->dyn_ltree + 0x121 <= (undefined1 *)__src->window_size) &&
           ((undefined1 *)__src->window_size <= __src[1].dyn_ltree + 0xf4)) {
          __dest->window_size =
               (ulg)(__dest->dyn_ltree +
                    ((long)(__src->window_size - (long)(__src->dyn_ltree + 0x121)) >> 2) + 0x121);
          __dest->prev = (Posf *)(__dest->dyn_ltree +
                                 ((long)__src->prev - (long)(__src->dyn_ltree + 0x121) >> 2) + 0x121
                                 );
        }
        *(ct_data_s **)&__dest->hash_shift =
             __dest->dyn_ltree +
             (*(long *)&__src->hash_shift - (long)(__src->dyn_ltree + 0x121) >> 2) + 0x121;
        if (pvStack_38 != (void *)0x0) {
          memcpy(pvStack_38,*(void **)&__src->method,
                 (ulong)(uint)(1 << ((byte)*(undefined4 *)&__src->gzhead & 0x1f)));
        }
        *(voidpf *)&__dest->method = pvStack_38;
        dest->state = __dest;
        dest_local._4_4_ = 0;
      }
      else {
        (*source->zfree)(source->opaque,__dest);
        dest_local._4_4_ = -4;
      }
    }
  }
  else {
    dest_local._4_4_ = -2;
  }
  return dest_local._4_4_;
}

Assistant:

int ZEXPORT inflateCopy(dest, source)
z_streamp dest;
z_streamp source;
{
    struct inflate_state FAR *state;
    struct inflate_state FAR *copy;
    unsigned char FAR *window;
    unsigned wsize;

    /* check input */
    if (inflateStateCheck(source) || dest == Z_NULL)
        return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)source->state;

    /* allocate space */
    copy = (struct inflate_state FAR *)
           ZALLOC(source, 1, sizeof(struct inflate_state));
    if (copy == Z_NULL) return Z_MEM_ERROR;
    window = Z_NULL;
    if (state->window != Z_NULL) {
        window = (unsigned char FAR *)
                 ZALLOC(source, 1U << state->wbits, sizeof(unsigned char));
        if (window == Z_NULL) {
            ZFREE(source, copy);
            return Z_MEM_ERROR;
        }
    }

    /* copy state */
    zmemcpy((voidpf)dest, (voidpf)source, sizeof(z_stream));
    zmemcpy((voidpf)copy, (voidpf)state, sizeof(struct inflate_state));
    copy->strm = dest;
    if (state->lencode >= state->codes &&
        state->lencode <= state->codes + ENOUGH - 1) {
        copy->lencode = copy->codes + (state->lencode - state->codes);
        copy->distcode = copy->codes + (state->distcode - state->codes);
    }
    copy->next = copy->codes + (state->next - state->codes);
    if (window != Z_NULL) {
        wsize = 1U << state->wbits;
        zmemcpy(window, state->window, wsize);
    }
    copy->window = window;
    dest->state = (struct internal_state FAR *)copy;
    return Z_OK;
}